

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O3

void __thiscall duckdb::MinMaxStringState::Assign(MinMaxStringState *this,string_t input)

{
  uint uVar1;
  undefined4 uVar2;
  char *pcVar3;
  ulong __n;
  uint uVar4;
  
  uVar4 = input.value._0_4_;
  if (uVar4 < 0xd) {
    if ((((this->super_MinMaxState<duckdb::string_t>).isset == true) &&
        (0xc < (this->super_MinMaxState<duckdb::string_t>).value.value.pointer.length)) &&
       (pcVar3 = (this->super_MinMaxState<duckdb::string_t>).value.value.pointer.ptr,
       pcVar3 != (char *)0x0)) {
      operator_delete__(pcVar3);
    }
    *(ulong *)&(this->super_MinMaxState<duckdb::string_t>).value.value = input.value._0_8_;
    pcVar3 = input.value._8_8_;
    goto LAB_0129aac9;
  }
  __n = input.value._0_8_ & 0xffffffff;
  if ((this->super_MinMaxState<duckdb::string_t>).isset == true) {
    uVar1 = (this->super_MinMaxState<duckdb::string_t>).value.value.pointer.length;
    if (uVar1 < uVar4) {
      if ((0xc < uVar1) &&
         (pcVar3 = (this->super_MinMaxState<duckdb::string_t>).value.value.pointer.ptr,
         pcVar3 != (char *)0x0)) {
        operator_delete__(pcVar3);
      }
      goto LAB_0129aa9d;
    }
    pcVar3 = (this->super_MinMaxState<duckdb::string_t>).value.value.pointer.ptr;
  }
  else {
LAB_0129aa9d:
    pcVar3 = (char *)operator_new__(__n);
  }
  switchD_015df945::default(pcVar3,input.value._8_8_,__n);
  uVar2 = *(undefined4 *)pcVar3;
  (this->super_MinMaxState<duckdb::string_t>).value.value.pointer.length = uVar4;
  *(undefined4 *)((long)&(this->super_MinMaxState<duckdb::string_t>).value.value + 4) = uVar2;
LAB_0129aac9:
  (this->super_MinMaxState<duckdb::string_t>).value.value.pointer.ptr = pcVar3;
  return;
}

Assistant:

void Assign(string_t input) {
		if (input.IsInlined()) {
			// inlined string - we can directly store it into the string_t without having to allocate anything
			Destroy();
			value = input;
		} else {
			// non-inlined string, need to allocate space for it somehow
			auto len = input.GetSize();
			char *ptr;
			if (!isset || value.GetSize() < len) {
				// we cannot fit this into the current slot - destroy it and re-allocate
				Destroy();
				ptr = new char[len];
			} else {
				// this fits into the current slot - take over the pointer
				ptr = value.GetDataWriteable();
			}
			memcpy(ptr, input.GetData(), len);

			value = string_t(ptr, UnsafeNumericCast<uint32_t>(len));
		}
	}